

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.cc
# Opt level: O2

bool xemmai::t_type_of<long>::f__greater(intptr_t a_self,t_pvalue *a_value)

{
  t_object *a_object;
  long lVar1;
  long lVar2;
  bool bVar3;
  wstring_view a_message;
  
  a_object = (a_value->super_t_pointer).v_p;
  if (a_object == (t_object *)0x4) {
    bVar3 = (a_value->field_0).v_float <= (double)a_self &&
            (double)a_self != (a_value->field_0).v_float;
  }
  else {
    if (a_object == (t_object *)0x3) {
      lVar1 = (a_value->field_0).v_integer;
      lVar2 = lVar1 - a_self;
    }
    else {
      bVar3 = t_cast<long>::f_is(a_object);
      if (!bVar3) {
        a_message._M_str = L"not supported.";
        a_message._M_len = 0xe;
        f_throw(a_message);
      }
      lVar1 = *(long *)a_object->v_data;
      lVar2 = lVar1 - a_self;
    }
    bVar3 = SBORROW8(lVar1,a_self) != lVar2 < 0;
  }
  return bVar3;
}

Assistant:

bool t_type_of<intptr_t>::f__greater(intptr_t a_self, const t_pvalue& a_value)
{
	switch (a_value.f_tag()) {
	case c_tag__INTEGER:
		return a_self > a_value.v_integer;
	case c_tag__FLOAT:
		return a_self > a_value.v_float;
	}
	t_object* p = a_value;
	if (f_is<intptr_t>(p)) return a_self > p->f_as<intptr_t>();
	f_throw(L"not supported."sv);
}